

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

MAP_RESULT Map_GetInternals(MAP_HANDLE handle,char ***keys,char ***values,size_t *count)

{
  undefined4 in_EAX;
  int iVar1;
  LOGGER_LOG p_Var2;
  MAP_RESULT MVar3;
  undefined1 auVar4 [16];
  
  auVar4._0_4_ = -(uint)(handle == (MAP_HANDLE)0x0);
  auVar4._4_4_ = -(uint)(keys == (char ***)0x0);
  auVar4._8_4_ = -(uint)(values == (char ***)0x0);
  auVar4._12_4_ = -(uint)(count == (size_t *)0x0);
  iVar1 = movmskps(in_EAX,auVar4);
  if (iVar1 == 0) {
    *keys = handle->keys;
    *values = handle->values;
    *count = handle->count;
    MVar3 = MAP_OK;
  }
  else {
    p_Var2 = xlogging_get_log_function();
    MVar3 = MAP_INVALIDARG;
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/map.c"
                ,"Map_GetInternals",0x24b,1,"result = %s%s (%d)","",MAP_RESULTStringStorage[3],3);
    }
  }
  return MVar3;
}

Assistant:

MAP_RESULT Map_GetInternals(MAP_HANDLE handle, const char*const** keys, const char*const** values, size_t* count)
{
    MAP_RESULT result;
    /*Codes_SRS_MAP_02_046: [If parameter handle, keys, values or count is NULL then Map_GetInternals shall return MAP_INVALIDARG.] */
    if (
        (handle == NULL) ||
        (keys == NULL) ||
        (values == NULL) ||
        (count == NULL)
        )
    {
        result = MAP_INVALIDARG;
        LOG_MAP_ERROR;
    }
    else
    {
        /*Codes_SRS_MAP_02_043: [Map_GetInternals shall produce in *keys an pointer to an array of const char* having all the keys stored so far by the map.]*/
        /*Codes_SRS_MAP_02_044: [Map_GetInternals shall produce in *values a pointer to an array of const char* having all the values stored so far by the map.]*/
        /*Codes_SRS_MAP_02_045: [  Map_GetInternals shall produce in *count the number of stored keys and values.]*/
        MAP_HANDLE_DATA * handleData = (MAP_HANDLE_DATA *)handle;
        *keys =(const char* const*)(handleData->keys);
        *values = (const char* const*)(handleData->values);
        *count = handleData->count;
        result = MAP_OK;
    }
    return result;
}